

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O0

void __thiscall flow::Instr::~Instr(Instr *this)

{
  Value *this_00;
  bool bVar1;
  reference ppVVar2;
  BasicBlock *this_01;
  BasicBlock *local_60;
  BasicBlock *oldBB;
  BasicBlock *parent;
  Value *op;
  iterator __end1;
  iterator __begin1;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *__range1;
  Instr *this_local;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__Instr_002ba188;
  __end1 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::begin(&this->operands_);
  op = (Value *)std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::end(&this->operands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                                     *)&op), bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppVVar2;
    if (this_00 != (Value *)0x0) {
      Value::removeUse(this_00,this);
      this_01 = getBasicBlock(this);
      if (this_01 != (BasicBlock *)0x0) {
        if (this_00 == (Value *)0x0) {
          local_60 = (BasicBlock *)0x0;
        }
        else {
          local_60 = (BasicBlock *)__dynamic_cast(this_00,&Value::typeinfo,&BasicBlock::typeinfo,0);
        }
        if (local_60 != (BasicBlock *)0x0) {
          BasicBlock::unlinkSuccessor(this_01,local_60);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>::
    operator++(&__end1);
  }
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&this->operands_);
  Value::~Value(&this->super_Value);
  return;
}

Assistant:

Instr::~Instr() {
  for (Value* op : operands_) {
    if (op != nullptr) {
      // remove this instruction as user of that operand
      op->removeUse(this);

      // if operand is a BasicBlock, unlink it as successor
      if (BasicBlock* parent = getBasicBlock(); parent != nullptr) {
        if (BasicBlock* oldBB = dynamic_cast<BasicBlock*>(op)) {
          parent->unlinkSuccessor(oldBB);
        }
      }
    }
  }
}